

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O3

vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> * __thiscall
tinyusdz::lerp<std::array<float,3ul>>
          (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
           *__return_storage_ptr__,tinyusdz *this,
          vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *a,
          vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *b,double t)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer paVar5;
  ulong uVar6;
  long lVar7;
  ulong __new_size;
  float fVar8;
  float fVar9;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = (*(long *)(this + 8) - *(long *)this >> 2) * -0x5555555555555555;
  __new_size = ((long)(a->
                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(a->
                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  if (uVar6 <= __new_size) {
    __new_size = uVar6;
  }
  if (__new_size != 0) {
    ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::resize
              (__return_storage_ptr__,__new_size);
    if (*(long *)(this + 8) - *(long *)this ==
        (long)(a->
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start) {
      fVar8 = (float)(1.0 - t);
      fVar9 = (float)t;
      lVar7 = 8;
      do {
        paVar5 = (a->
                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        fVar1 = *(float *)((long)paVar5->_M_elems + lVar7);
        fVar2 = *(float *)(*(long *)this + lVar7);
        uVar3 = *(undefined8 *)(*(long *)this + -8 + lVar7);
        uVar4 = *(undefined8 *)((long)paVar5->_M_elems + lVar7 + -8);
        paVar5 = (__return_storage_ptr__->
                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)paVar5->_M_elems + lVar7 + -8) =
             CONCAT44((float)((ulong)uVar4 >> 0x20) * fVar9 + (float)((ulong)uVar3 >> 0x20) * fVar8,
                      (float)uVar4 * fVar9 + (float)uVar3 * fVar8);
        *(float *)((long)paVar5->_M_elems + lVar7) = fVar1 * fVar9 + fVar2 * fVar8;
        lVar7 = lVar7 + 0xc;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}